

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

HighsStatus
calculateRowValuesQuad
          (HighsLp *lp,vector<double,_std::allocator<double>_> *col_value,
          vector<double,_std::allocator<double>_> *row_value,HighsInt report_row)

{
  double *pdVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer piVar5;
  bool bVar6;
  HighsStatus HVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> row_value_quad;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_68;
  value_type local_48;
  
  pdVar3 = (col_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = (col_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = lp->num_col_;
  bVar6 = HighsSparseMatrix::isColwise(&lp->a_matrix_);
  HVar7 = kError;
  if ((bVar6) && (iVar2 == (int)((ulong)((long)pdVar3 - (long)pdVar4) >> 3))) {
    local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.hi = 0.0;
    local_48.lo = 0.0;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::_M_fill_assign
              (&local_68,(long)lp->num_row_,&local_48);
    if (0 < lp->num_col_) {
      uVar8 = 0;
      do {
        piVar5 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar2 = piVar5[uVar8];
        lVar11 = (long)iVar2;
        uVar9 = uVar8 + 1;
        if (iVar2 < piVar5[uVar8 + 1]) {
          do {
            iVar2 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11];
            lVar10 = (long)iVar2;
            pdVar3 = (col_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            dVar14 = pdVar3[uVar8] *
                     (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar11];
            dVar13 = local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar10].hi;
            dVar12 = dVar14 + dVar13;
            local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10].hi = dVar12;
            dVar13 = (dVar13 - (dVar12 - dVar14)) + (dVar14 - (dVar12 - (dVar12 - dVar14))) +
                     local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar10].lo;
            local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10].lo = dVar13;
            if (iVar2 == report_row) {
              printf("calculateRowValuesQuad: Row %d becomes %g due to contribution of .col_value[%d] = %g\n"
                     ,dVar12 + dVar13,pdVar3[uVar8],lVar10,uVar8 & 0xffffffff);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar9]);
        }
        uVar8 = uVar9;
      } while ((long)uVar9 < (long)lp->num_col_);
    }
    std::vector<double,_std::allocator<double>_>::resize(row_value,(long)lp->num_row_);
    if (local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pdVar3 = (row_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      do {
        pdVar1 = (double *)
                 ((long)&(local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                          _M_impl.super__Vector_impl_data._M_start)->hi + lVar11 * 2);
        *(double *)((long)pdVar3 + lVar11) = *pdVar1 + pdVar1[1];
        lVar11 = lVar11 + 8;
      } while ((pointer)(pdVar1 + 2) !=
               local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    HVar7 = kOk;
  }
  return HVar7;
}

Assistant:

HighsStatus calculateRowValuesQuad(const HighsLp& lp,
                                   const std::vector<double>& col_value,
                                   std::vector<double>& row_value,
                                   const HighsInt report_row) {
  const bool correct_size = int(col_value.size()) == lp.num_col_;
  const bool is_colwise = lp.a_matrix_.isColwise();
  const bool data_error = !correct_size || !is_colwise;
  assert(!data_error);
  if (data_error) return HighsStatus::kError;

  std::vector<HighsCDouble> row_value_quad;
  row_value_quad.assign(lp.num_row_, HighsCDouble{0.0});

  for (HighsInt col = 0; col < lp.num_col_; col++) {
    for (HighsInt i = lp.a_matrix_.start_[col];
         i < lp.a_matrix_.start_[col + 1]; i++) {
      const HighsInt row = lp.a_matrix_.index_[i];
      assert(row >= 0);
      assert(row < lp.num_row_);
      row_value_quad[row] += col_value[col] * lp.a_matrix_.value_[i];
      if (row == report_row) {
        printf(
            "calculateRowValuesQuad: Row %d becomes %g due to contribution of "
            ".col_value[%d] = %g\n",
            int(row), double(row_value_quad[row]), int(col), col_value[col]);
      }
    }
  }

  // assign quad values to double vector
  row_value.resize(lp.num_row_);
  std::transform(row_value_quad.begin(), row_value_quad.end(),
                 row_value.begin(), [](HighsCDouble x) { return double(x); });

  return HighsStatus::kOk;
}